

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

OptionType __thiscall
args::ArgumentParser::ParseOption(ArgumentParser *this,string *s,bool allowEmpty)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  bool allowEmpty_local;
  string *s_local;
  ArgumentParser *this_local;
  
  lVar1 = std::__cxx11::string::find((string *)s,(ulong)&this->longprefix);
  if (lVar1 == 0) {
    if (allowEmpty) {
      return LongFlag;
    }
    uVar2 = std::__cxx11::string::length();
    uVar3 = std::__cxx11::string::length();
    if (uVar3 < uVar2) {
      return LongFlag;
    }
  }
  lVar1 = std::__cxx11::string::find((string *)s,(ulong)&this->shortprefix);
  if (lVar1 == 0) {
    if (!allowEmpty) {
      uVar2 = std::__cxx11::string::length();
      uVar3 = std::__cxx11::string::length();
      if (uVar2 <= uVar3) goto LAB_00126707;
    }
    this_local._4_4_ = ShortFlag;
  }
  else {
LAB_00126707:
    this_local._4_4_ = Positional;
  }
  return this_local._4_4_;
}

Assistant:

OptionType ParseOption(const std::string &s, bool allowEmpty = false)
            {
                if (s.find(longprefix) == 0 && (allowEmpty || s.length() > longprefix.length()))
                {
                    return OptionType::LongFlag;
                }

                if (s.find(shortprefix) == 0 && (allowEmpty || s.length() > shortprefix.length()))
                {
                    return OptionType::ShortFlag;
                }

                return OptionType::Positional;
            }